

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grow_one_util.cpp
# Opt level: O2

bool __thiscall
SMC::grow_one_with_sc
          (SMC *this,Structure *CurConf,int Position,int tmpEnd,int LoopChosen,Atom *EndPt)

{
  double dVar1;
  double dVar2;
  double lcd;
  short sVar3;
  uint uVar4;
  Atom *pAVar5;
  Atom *pAVar6;
  Residue *pRVar7;
  undefined4 n;
  undefined8 uVar8;
  int i;
  long lVar9;
  ulong uVar10;
  ostream *poVar11;
  undefined1 (*pauVar12) [16];
  int i_1;
  ulong uVar13;
  ulong uVar14;
  Residue *pRVar15;
  Residue *pRVar16;
  ulong uVar17;
  ulong uVar18;
  int j;
  long lVar19;
  pointer *normal_Svalue;
  double *pdVar20;
  bool bVar21;
  uint uVar22;
  int iVar23;
  double (*padVar24) [6];
  Residue *pRVar25;
  long lVar26;
  long lVar27;
  void *__s;
  double (*__s_00) [6];
  double dVar28;
  double dVar29;
  pointer pdVar30;
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  undefined1 auVar42 [16];
  undefined1 auStack_1c88 [248];
  double adStack_1b90 [2];
  Point PStack_1b80;
  Point PStack_1b68;
  Point PStack_1b50;
  undefined1 auStack_1b38 [8];
  vector<double,_std::allocator<double>_> prob;
  undefined1 local_c38 [8];
  int deadlabel [160];
  int Phi [160];
  int Psi [160];
  int TorProb [160];
  Residue sam;
  void *local_a8;
  double local_98;
  ulong local_58;
  void *local_40;
  
  uVar4 = this->num_dist_states;
  uVar10 = (ulong)uVar4;
  sVar3 = CurConf->_res[Position]._type;
  lVar9 = -(uVar10 * 0x18 + 0xf & 0xfffffffffffffff0);
  lVar26 = lVar9 + -0x1b38;
  pAVar5 = CurConf->_res[Position]._atom;
  *(undefined8 *)(auStack_1b38 + lVar9 + -8) = 0x126dbe;
  dVar28 = Point::dis(&pAVar5[1].super_Point,&EndPt->super_Point);
  uVar22 = tmpEnd - Position;
  dVar31 = this->minDistcon[1][(int)uVar22];
  bVar21 = false;
  if ((dVar31 <= dVar28) &&
     (bVar21 = false, dVar28 <= this->DistconBy[1][(int)uVar22] * 31.0 + dVar31)) {
    dVar31 = *(double *)((long)(this->minDistcon + -1) + ((long)(int)uVar22 + 0x13) * 8);
    dVar1 = this->DistconBy[-1][(long)(int)uVar22 + 0x13];
    pRVar16 = (Residue *)local_c38;
    *(undefined8 *)(auStack_1b38 + lVar9 + -8) = 0x126e51;
    memset(pRVar16,0,0x280);
    normal_Svalue =
         &prob.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_finish;
    iVar23 = 0;
    for (lVar27 = 0; lVar27 != 0xa0; lVar27 = lVar27 + 1) {
      *(undefined8 *)(auStack_1b38 + lVar9 + -8) = 0x1e;
      uVar8 = *(undefined8 *)(auStack_1b38 + lVar9 + -8);
      *(undefined8 *)(auStack_1b38 + lVar9 + -8) = 0x126ea2;
      Residue::Residue((Residue *)(TorProb + 0x9e),(int)uVar8);
      Psi[lVar27 + 0x9e] = -1;
      pAVar5 = CurConf->_res[Position]._atom;
      dVar29 = Residue::bond_angle[sVar3][2];
      dVar2 = Residue::bond_length[sVar3][2];
      *(undefined8 *)(auStack_1b38 + lVar9 + -0x10) = 1;
      uVar8 = *(undefined8 *)(auStack_1b38 + lVar9 + -0x10);
      *(ulong *)(auStack_1b38 + lVar9 + -0x10) = (ulong)uVar22;
      *(undefined8 *)((long)&PStack_1b50 + lVar9) = 0x126efe;
      sample_distance(this,pAVar5,pAVar5 + 1,EndPt,dVar29,dVar2,(Atom *)(TorProb._632_8_ + 0xa0),
                      dVar28,(int)uVar8,*(int *)(auStack_1b38 + lVar9 + -0x10));
      if ((*(ulong *)(TorProb._632_8_ + 0xa0) & 0x7fffffffffffffff) < 0x7ff0000000000000) {
        *(undefined8 *)(auStack_1b38 + lVar9 + -8) = 0x126f69;
        dVar29 = Point::dis((Point *)(TorProb._632_8_ + 0xa0),&EndPt->super_Point);
        if ((dVar29 < dVar31) || (dVar1 * 31.0 + dVar31 < dVar29)) goto LAB_00126f2a;
        pAVar5 = CurConf->_res[Position]._atom;
        dVar2 = Residue::bond_angle[sVar3][0];
        lcd = Residue::bond_length[sVar3][0];
        *(ulong *)(auStack_1b38 + lVar9 + -0x10) = (ulong)(uVar22 - 1);
        *(undefined8 *)((long)&PStack_1b50 + lVar9) = 0x126fc9;
        sample_distance(this,pAVar5 + 1,(Atom *)(TorProb._632_8_ + 0xa0),EndPt,dVar2,lcd,
                        (Atom *)TorProb._632_8_,dVar29,0,*(int *)(auStack_1b38 + lVar9 + -0x10));
        if (0x7fefffffffffffff < (*(ulong *)TorProb._632_8_ & 0x7fffffffffffffff))
        goto LAB_00126f2a;
        pAVar5 = CurConf->_res[(long)Position + -1]._atom;
        pAVar6 = CurConf->_res[Position]._atom;
        *(undefined8 *)(auStack_1b38 + lVar9 + -8) = *(undefined8 *)(TorProb._632_8_ + 0xb0);
        uVar8 = *(undefined8 *)(TorProb._632_8_ + 0xa8);
        *(undefined8 *)((long)&PStack_1b50 + lVar9) = *(undefined8 *)(TorProb._632_8_ + 0xa0);
        *(undefined8 *)(auStack_1b38 + lVar9 + -0x10) = uVar8;
        *(double *)((long)&PStack_1b68 + lVar9 + 0x10) = pAVar6[1].super_Point.z;
        dVar29 = pAVar6[1].super_Point.y;
        *(double *)((long)&PStack_1b68 + lVar9) = pAVar6[1].super_Point.x;
        *(double *)((long)&PStack_1b68 + lVar9 + 8) = dVar29;
        *(double *)((long)&PStack_1b80 + lVar9 + 0x10) = (pAVar6->super_Point).z;
        dVar29 = (pAVar6->super_Point).y;
        *(double *)((long)&PStack_1b80 + lVar9) = (pAVar6->super_Point).x;
        *(double *)((long)&PStack_1b80 + lVar9 + 8) = dVar29;
        *(double *)((long)adStack_1b90 + lVar9 + 8) = pAVar5[2].super_Point.z;
        dVar29 = pAVar5[2].super_Point.y;
        *(double *)(auStack_1c88 + lVar9 + 0xf0) = pAVar5[2].super_Point.x;
        *(double *)((long)adStack_1b90 + lVar9) = dVar29;
        *(undefined8 *)(auStack_1c88 + lVar9 + 0xe8) = 0x127068;
        dVar29 = torsion(*(Point *)(auStack_1c88 + lVar9 + 0xf0),
                         *(Point *)((long)&PStack_1b80 + lVar9),
                         *(Point *)((long)&PStack_1b68 + lVar9),
                         *(Point *)((long)&PStack_1b50 + lVar9),torsion_degrees);
        normal_Svalue[-2] = (pointer)dVar29;
        pAVar5 = CurConf->_res[Position]._atom;
        *(undefined8 *)(auStack_1b38 + lVar9 + -8) = *(undefined8 *)(TorProb._632_8_ + 0x10);
        uVar8 = *(undefined8 *)(TorProb._632_8_ + 8);
        *(undefined8 *)((long)&PStack_1b50 + lVar9) = *(undefined8 *)TorProb._632_8_;
        *(undefined8 *)(auStack_1b38 + lVar9 + -0x10) = uVar8;
        *(undefined8 *)((long)&PStack_1b68 + lVar9 + 0x10) = *(undefined8 *)(TorProb._632_8_ + 0xb0)
        ;
        uVar8 = *(undefined8 *)(TorProb._632_8_ + 0xa8);
        *(undefined8 *)((long)&PStack_1b68 + lVar9) = *(undefined8 *)(TorProb._632_8_ + 0xa0);
        *(undefined8 *)((long)&PStack_1b68 + lVar9 + 8) = uVar8;
        *(double *)((long)&PStack_1b80 + lVar9 + 0x10) = pAVar5[1].super_Point.z;
        dVar29 = pAVar5[1].super_Point.y;
        *(double *)((long)&PStack_1b80 + lVar9) = pAVar5[1].super_Point.x;
        *(double *)((long)&PStack_1b80 + lVar9 + 8) = dVar29;
        *(double *)((long)adStack_1b90 + lVar9 + 8) = (pAVar5->super_Point).z;
        dVar29 = (pAVar5->super_Point).y;
        *(double *)(auStack_1c88 + lVar9 + 0xf0) = (pAVar5->super_Point).x;
        *(double *)((long)adStack_1b90 + lVar9) = dVar29;
        *(undefined8 *)(auStack_1c88 + lVar9 + 0xe8) = 0x1270dd;
        pdVar30 = (pointer)torsion(*(Point *)(auStack_1c88 + lVar9 + 0xf0),
                                   *(Point *)((long)&PStack_1b80 + lVar9),
                                   *(Point *)((long)&PStack_1b68 + lVar9),
                                   *(Point *)((long)&PStack_1b50 + lVar9),torsion_degrees);
        ((_Vector_impl_data *)(normal_Svalue + -1))->_M_start = pdVar30;
        *(undefined8 *)(auStack_1b38 + lVar9 + -8) = 0x1270ff;
        box_MullerNsample_single((double *)normal_Svalue,3.14159265358979,0.06981317007977311);
        if (0x7fefffffffffffff < ((ulong)*normal_Svalue & 0x7fffffffffffffff)) goto LAB_00126f2a;
      }
      else {
LAB_00126f2a:
        Psi[lVar27 + 0x9e] = 0;
        *(undefined4 *)(local_c38 + lVar27 * 4) = 1;
        iVar23 = iVar23 + 1;
      }
      pRVar16 = (Residue *)(TorProb + 0x9e);
      *(undefined8 *)(auStack_1b38 + lVar9 + -8) = 0x126f4e;
      Residue::~Residue(pRVar16);
      normal_Svalue = normal_Svalue + 3;
    }
    if (iVar23 == 0xa0) {
      bVar21 = false;
    }
    else {
      pauVar12 = (undefined1 (*) [16])auStack_1b38;
      iVar23 = 0;
      for (lVar27 = 0; lVar27 != 0xa0; lVar27 = lVar27 + 1) {
        if (Psi[lVar27 + 0x9e] == -1) {
          auVar42 = divpd(*pauVar12,_DAT_0014a0b0);
          iVar38 = (int)auVar42._0_8_;
          iVar39 = (int)auVar42._8_8_;
          iVar40 = iVar38 + (int)DAT_0014a0c0;
          iVar41 = iVar39 + DAT_0014a0c0._4_4_;
          auVar34._8_8_ = -(ulong)(auVar42._8_8_ + 36.0 < (double)iVar41);
          auVar34._0_8_ = -(ulong)(auVar42._0_8_ + 36.0 < (double)iVar40);
          uVar22 = movmskpd((int)pRVar16,auVar34);
          if ((uVar22 & 1) != 0) {
            iVar40 = iVar38 + 0x23;
          }
          if ((uVar22 & 2) != 0) {
            iVar41 = iVar39 + 0x23;
          }
          deadlabel[lVar27 + 0x9e] = iVar40;
          Phi[lVar27 + 0x9e] = iVar41;
          pRVar16 = (Residue *)(long)iVar41;
          iVar40 = this->Joint_Angle[sVar3][iVar40][(long)pRVar16];
          Psi[lVar27 + 0x9e] = iVar40;
          iVar23 = iVar23 + iVar40;
        }
        pauVar12 = (undefined1 (*) [16])(pauVar12[1] + 8);
      }
      if ((iVar23 == 0) || (this->use_rot_lib != true)) {
        uVar13 = 0;
        uVar14 = 0;
        if (0 < (int)uVar4) {
          uVar14 = uVar10;
        }
        for (; uVar13 != uVar14; uVar13 = uVar13 + 1) {
          *(undefined8 *)(auStack_1b38 + lVar9 + -8) = 0x127385;
          iVar23 = rand();
          do {
            lVar27 = (long)(iVar23 % 0xa0);
            iVar23 = iVar23 % 0xa0 + 1;
          } while (*(int *)(local_c38 + lVar27 * 4) == 1);
          *(undefined8 *)(auStack_1b38 + lVar9 + -8) = 0x1273a0;
          iVar40 = rand();
          iVar23 = deadlabel[lVar27 + 0x9e];
          *(undefined8 *)(auStack_1b38 + lVar9 + -8) = 0x1273bd;
          iVar41 = rand();
          auVar42._0_8_ = (double)iVar40 + 0.5;
          auVar42._8_8_ = (double)iVar41 + 0.5;
          auVar42 = divpd(auVar42,_DAT_0014a0f0);
          auVar37._0_8_ = (double)(iVar23 + -0x23) * 3.14159265358979;
          auVar37._8_8_ = (double)(Phi[lVar27 + 0x9e] + -0x23) * 3.14159265358979;
          auVar37 = divpd(auVar37,_DAT_0014a0d0);
          auVar36._0_8_ = (double)(iVar23 + -0x24) * 3.14159265358979;
          auVar36._8_8_ = (double)(Phi[lVar27 + 0x9e] + -0x24) * 3.14159265358979;
          auVar34 = divpd(auVar36,_DAT_0014a0d0);
          *(double *)(auStack_1b38 + uVar13 * 0x18 + lVar26 + 0x1b38) =
               (auVar37._0_8_ - auVar34._0_8_) * auVar42._0_8_ + auVar34._0_8_;
          *(double *)((long)(auStack_1b38 + uVar13 * 0x18 + lVar26 + 0x1b38) + 8) =
               (auVar37._8_8_ - auVar34._8_8_) * auVar42._8_8_ + auVar34._8_8_;
          *(pointer *)((long)&prob + uVar13 * 0x18 + lVar9 + 8) =
               (&prob)[lVar27].super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
        }
      }
      else {
        uVar13 = 0;
        uVar14 = 0;
        if (0 < (int)uVar4) {
          uVar14 = uVar10;
        }
        for (; uVar13 != uVar14; uVar13 = uVar13 + 1) {
          *(undefined8 *)(auStack_1b38 + lVar9 + -8) = 0x127259;
          iVar40 = rand();
          pdVar20 = &PStack_1b50.z;
          iVar41 = 0;
          lVar27 = 0;
          do {
            lVar19 = lVar27;
            if (lVar19 == 0xa0) goto LAB_00127350;
            iVar41 = iVar41 + Psi[lVar19 + 0x9e];
            pdVar20 = pdVar20 + 3;
            lVar27 = lVar19 + 1;
          } while (iVar41 <= iVar40 % iVar23);
          *(undefined8 *)(auStack_1b38 + lVar9 + -8) = 0x12728e;
          iVar41 = rand();
          iVar40 = deadlabel[lVar19 + 0x9e];
          *(undefined8 *)(auStack_1b38 + lVar9 + -8) = 0x1272b2;
          iVar38 = rand();
          auVar32._0_8_ = (double)iVar41 + 0.5;
          auVar32._8_8_ = (double)iVar38 + 0.5;
          auVar42 = divpd(auVar32,_DAT_0014a0f0);
          auVar35._0_8_ = (double)(iVar40 + -0x23) * 3.14159265358979;
          auVar35._8_8_ = (double)(Phi[lVar19 + 0x9e] + -0x23) * 3.14159265358979;
          auVar36 = divpd(auVar35,_DAT_0014a0d0);
          auVar33._0_8_ = (double)(iVar40 + -0x24) * 3.14159265358979;
          auVar33._8_8_ = (double)(Phi[lVar19 + 0x9e] + -0x24) * 3.14159265358979;
          auVar34 = divpd(auVar33,_DAT_0014a0d0);
          *(double *)(auStack_1b38 + uVar13 * 0x18 + lVar26 + 0x1b38) =
               (auVar36._0_8_ - auVar34._0_8_) * auVar42._0_8_ + auVar34._0_8_;
          *(double *)((long)(auStack_1b38 + uVar13 * 0x18 + lVar26 + 0x1b38) + 8) =
               (auVar36._8_8_ - auVar34._8_8_) * auVar42._8_8_ + auVar34._8_8_;
          *(double *)((long)&prob + uVar13 * 0x18 + lVar9 + 8) = *pdVar20;
LAB_00127350:
        }
      }
      uVar22 = this->num_sc_states;
      uVar17 = (ulong)uVar22;
      __s_00 = (double (*) [6])(auStack_1b38 + (lVar26 - uVar17 * 0x30 * uVar10) + 0x1b38);
      __s_00[-1][5] = 5.97575363038863e-318;
      memset(__s_00,0,(long)(int)(uVar22 * uVar4 * 6) << 3);
      uVar14 = 0;
      padVar24 = __s_00;
      uVar13 = 0;
      if (0 < (int)uVar4) {
        uVar14 = uVar10;
        uVar13 = uVar10;
      }
      while (uVar14 != 0) {
        pRVar16 = CurConf->_res;
        iVar23 = this->num_sc_states;
        iVar40 = this->ang_type;
        __s_00[-1][5] = 5.97605006977613e-318;
        sample_sc_angles(pRVar16 + Position,padVar24,iVar23,iVar40);
        uVar14 = uVar14 - 1;
        padVar24 = padVar24 + uVar17;
      }
      uVar22 = this->num_sc_states;
      uVar14 = (ulong)uVar22;
      lVar9 = uVar14 * uVar10;
      pRVar16 = (Residue *)(__s_00 + lVar9 * -7);
      if (lVar9 == 0) {
        lVar27 = 0;
        local_58 = uVar14;
      }
      else {
        lVar27 = 0;
        pRVar16[-1]._center._posn = 0x1e;
        pRVar16[-1]._center._state = 0;
        *(undefined2 *)&pRVar16[-1]._center.field_0x4e = 0;
        n = pRVar16[-1]._center._posn;
        do {
          pRVar16[-1]._center._posn = 0x12753a;
          pRVar16[-1]._center._state = 0;
          *(undefined2 *)&pRVar16[-1]._center.field_0x4e = 0;
          Residue::Residue((Residue *)((long)pRVar16->_scChi + lVar27 + -0x28),n);
          lVar27 = lVar27 + 0x150;
        } while (lVar9 * 0x150 - lVar27 != 0);
        uVar22 = this->num_sc_states;
        lVar27 = uVar22 * uVar10;
        local_58 = (ulong)uVar22;
      }
      __s = (void *)((long)pRVar16 - (lVar27 * 8 + 0xfU & 0xfffffffffffffff0));
      *(undefined8 *)((long)__s + -8) = 0x1275a2;
      memset(__s,0,(long)(int)(uVar4 * uVar22) << 3);
      local_98 = 1.79769313486232e+308;
      pRVar15 = pRVar16;
      local_40 = __s;
      for (uVar10 = 0; uVar10 != uVar13; uVar10 = uVar10 + 1) {
        pdVar20 = (double *)(auStack_1b38 + uVar10 * 0x18 + lVar26 + 0x1b38);
        pRVar25 = pRVar15;
        padVar24 = __s_00;
        for (lVar27 = 0; lVar27 < (int)uVar22; lVar27 = lVar27 + 1) {
          pRVar7 = CurConf->_res;
          *(undefined8 *)((long)__s + -8) = 0x127640;
          Residue::operator=(pRVar25,pRVar7 + Position);
          dVar28 = *pdVar20;
          dVar1 = pdVar20[1];
          pRVar25->_phi = dVar28;
          pRVar25->_psi = dVar1;
          dVar31 = pdVar20[2];
          pRVar25->_omega = dVar31;
          *(undefined8 *)((long)__s + -8) = 0x12766f;
          Structure::calBBCo(CurConf,Position,pRVar25,dVar28,dVar1,dVar31);
          *(undefined8 *)((long)__s + -8) = 0x12767d;
          Structure::calSCCo(CurConf,*padVar24,pRVar25);
          *(undefined8 *)((long)__s + -8) = 0x12768a;
          Structure::SinglecalCenter(CurConf,pRVar25,0);
          *(undefined8 *)((long)__s + -8) = 0x12769c;
          dVar31 = one_res_en_loodis_all_list(CurConf,pRVar25,&this->Reslist);
          *(double *)((long)local_40 + lVar27 * 8) = dVar31;
          if (local_98 <= dVar31) {
            dVar31 = local_98;
          }
          uVar22 = this->num_sc_states;
          padVar24 = padVar24 + 1;
          pRVar25 = pRVar25 + 1;
          local_98 = dVar31;
        }
        local_40 = (void *)((long)local_40 + local_58 * 8);
        __s_00 = __s_00 + uVar17;
        pRVar15 = pRVar15 + uVar14;
      }
      deadlabel[0x9e] = 0;
      deadlabel[0x9f] = 0;
      *(undefined8 *)((long)__s + -8) = 0x12772c;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)auStack_1b38,(long)(int)(uVar22 * uVar4)
                 ,(value_type_conflict3 *)(deadlabel + 0x9e),(allocator_type *)(Phi + 0x9e));
      dVar31 = 0.0;
      local_a8 = __s;
      for (uVar10 = 0; uVar10 != uVar13; uVar10 = uVar10 + 1) {
        lVar26 = 0;
        while (iVar23 = this->num_sc_states, lVar26 < iVar23) {
          dVar28 = *(double *)((long)local_a8 + lVar26 * 8);
          *(undefined8 *)((long)__s + -8) = 0x127789;
          dVar28 = pow(2.718281828,(local_98 - dVar28) * 0.5);
          *(double *)((long)auStack_1b38 + (long)(iVar23 * (int)uVar10 + (int)lVar26) * 8) = dVar28;
          if (0x7fefffffffffffff < (ulong)ABS(dVar28)) {
            *(undefined8 *)((long)__s + -8) = 0x127af5;
            __assert_fail("std::isfinite(prob[k])",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                          ,0x30d,
                          "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                         );
          }
          dVar31 = dVar31 + dVar28;
          lVar26 = lVar26 + 1;
          if (0x7fefffffffffffff < (long)ABS(dVar31)) {
            *(undefined8 *)((long)__s + -8) = 0x127ad6;
            __assert_fail("std::isfinite(sum)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                          ,0x314,
                          "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                         );
          }
        }
        local_a8 = (void *)((long)local_a8 + local_58 * 8);
      }
      if (dVar31 <= 1e-10) {
        uVar4 = this->num_sc_states;
        lVar26 = 0;
        uVar10 = 0;
        if (0 < (int)uVar4) {
          uVar10 = (ulong)uVar4;
        }
        for (uVar17 = 0; uVar17 != uVar13; uVar17 = uVar17 + 1) {
          for (uVar18 = 0; uVar10 != uVar18; uVar18 = uVar18 + 1) {
            *(undefined8 *)((long)auStack_1b38 + uVar18 * 8 + lVar26) = 0x3ff0000000000000;
          }
          lVar26 = lVar26 + (long)(int)uVar4 * 8;
        }
      }
      *(undefined8 *)((long)__s + -8) = 0x127815;
      iVar23 = SampleOne((vector<double,_std::allocator<double>_> *)auStack_1b38);
      sVar3 = CurConf->_res[Position]._type;
      if ((sVar3 == -1) || (sVar3 == -0x3039)) {
        *(undefined8 *)((long)__s + -8) = 0x127b08;
        poVar11 = std::operator<<((ostream *)&std::cout,"grow_one_bb_only atom type error ");
        *(undefined8 *)((long)__s + -8) = 0x127b13;
        poVar11 = (ostream *)std::ostream::operator<<(poVar11,Position);
        *(undefined8 *)((long)__s + -8) = 0x127b1b;
        std::endl<char,std::char_traits<char>>(poVar11);
        *(undefined8 *)((long)__s + -8) = 0x127b22;
        exit(0);
      }
      iVar40 = this->num_sc_states;
      pAVar5 = CurConf->_res[Position]._atom;
      *(undefined8 *)((long)__s + -8) = 0x127853;
      iVar41 = Atom::is_at_origin(pAVar5);
      if (iVar41 != 0) {
        *(undefined8 *)((long)__s + -8) = 0x127b41;
        __assert_fail("!CurConf._res[Position]._atom[ATM_N].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x331,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      pAVar5 = CurConf->_res[Position]._atom;
      *(undefined8 *)((long)__s + -8) = 0x12786c;
      iVar41 = Atom::is_at_origin(pAVar5 + 1);
      if (iVar41 != 0) {
        *(undefined8 *)((long)__s + -8) = 0x127b60;
        __assert_fail("!CurConf._res[Position]._atom[ATM_CA].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x332,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      pAVar5 = CurConf->_res[Position]._atom;
      *(undefined8 *)((long)__s + -8) = 0x127886;
      iVar41 = Atom::is_at_origin(pAVar5 + 2);
      if (iVar41 == 0) {
        *(undefined8 *)((long)__s + -8) = 0x127b7f;
        __assert_fail("CurConf._res[Position]._atom[ATM_C].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x333,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      pAVar5 = CurConf->_res[Position]._atom;
      *(undefined8 *)((long)__s + -8) = 0x1278a0;
      iVar41 = Atom::is_at_origin(pAVar5 + 3);
      if (iVar41 == 0) {
        *(undefined8 *)((long)__s + -8) = 0x127b9e;
        __assert_fail("CurConf._res[Position]._atom[ATM_O].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x334,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      iVar38 = Position + 1;
      pAVar5 = CurConf->_res[iVar38]._atom;
      *(undefined8 *)((long)__s + -8) = 0x1278c4;
      iVar41 = Atom::is_at_origin(pAVar5);
      if (iVar41 == 0) {
        *(undefined8 *)((long)__s + -8) = 0x127bbd;
        __assert_fail("CurConf._res[Position + 1]._atom[ATM_N].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x335,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      pAVar5 = CurConf->_res[iVar38]._atom;
      *(undefined8 *)((long)__s + -8) = 0x1278dd;
      iVar41 = Atom::is_at_origin(pAVar5 + 1);
      if (iVar41 == 0) {
        *(undefined8 *)((long)__s + -8) = 0x127bdc;
        __assert_fail("CurConf._res[Position + 1]._atom[ATM_CA].is_at_origin()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                      ,0x336,
                      "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                     );
      }
      pRVar25 = pRVar16 + (long)(iVar23 % iVar40) + (long)(iVar23 / iVar40) * uVar14;
      pAVar5 = CurConf->_res[Position]._atom;
      pAVar6 = pRVar25->_atom;
      *(undefined8 *)((long)__s + -8) = 0x127924;
      Atom::CopyPos(pAVar5 + 2,pAVar6 + 2);
      pAVar5 = CurConf->_res[Position]._atom;
      pAVar6 = pRVar25->_atom;
      *(undefined8 *)((long)__s + -8) = 0x127940;
      Atom::CopyPos(pAVar5 + 3,pAVar6 + 3);
      pAVar5 = CurConf->_res[iVar38]._atom;
      pAVar6 = pRVar25->_atom;
      *(undefined8 *)((long)__s + -8) = 0x127950;
      Atom::CopyPos(pAVar5,pAVar6);
      pAVar5 = CurConf->_res[iVar38]._atom;
      pAVar6 = pRVar25->_atom;
      *(undefined8 *)((long)__s + -8) = 0x127968;
      Atom::CopyPos(pAVar5 + 1,pAVar6 + 1);
      pRVar15 = CurConf->_res;
      if (pRVar15[Position]._type != 5) {
        pAVar5 = pRVar15[Position]._atom;
        *(undefined8 *)((long)__s + -8) = 0x127991;
        iVar23 = Atom::is_at_origin(pAVar5 + 5);
        if (iVar23 == 0) {
          *(undefined8 *)((long)__s + -8) = 0x127bfb;
          __assert_fail("CurConf._res[Position]._atom[ATM_CB].is_at_origin()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                        ,0x347,
                        "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                       );
        }
        pAVar5 = CurConf->_res[Position]._atom;
        pAVar6 = pRVar25->_atom;
        *(undefined8 *)((long)__s + -8) = 0x1279af;
        Atom::CopyPos(pAVar5 + 5,pAVar6 + 5);
        pRVar15 = CurConf->_res;
        if (pRVar25->_numAtom != pRVar15[Position]._numAtom) {
          *(undefined1 **)((long)__s + -8) = &LAB_00127c1a;
          __assert_fail("chosen_res._numAtom == CurConf._res[Position]._numAtom",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/uic-lianglab[P]ompg-public/source/grow_one_util.cpp"
                        ,0x34b,
                        "bool SMC::grow_one_with_sc(Structure &, const int, const int, const int, const Atom &)"
                       );
        }
        *(undefined8 *)((long)__s + -8) = 6;
        lVar27 = 0x1e0;
        for (lVar26 = *(long *)((long)__s + -8); lVar26 < pRVar15[Position]._numAtom;
            lVar26 = lVar26 + 1) {
          pAVar5 = pRVar15[Position]._atom;
          pAVar6 = pRVar25->_atom;
          *(undefined8 *)((long)__s + -8) = 0x1279f0;
          Atom::CopyPos((Atom *)((long)&(pAVar5->super_Point).x + lVar27),
                        (Atom *)((long)&(pAVar6->super_Point).x + lVar27));
          pRVar15 = CurConf->_res;
          lVar27 = lVar27 + 0x50;
        }
      }
      *(undefined8 *)((long)__s + -8) = 0x127a66;
      Structure::SinglecalCenter(CurConf,pRVar15 + Position,0);
      *(undefined8 *)((long)__s + -8) = 0x127a72;
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                ((_Vector_base<double,_std::allocator<double>_> *)auStack_1b38);
      bVar21 = true;
      if (lVar9 != 0) {
        lVar9 = lVar9 * 0x150;
        do {
          *(undefined8 *)((long)__s + -8) = 0x127a9c;
          Residue::~Residue((Residue *)((long)pRVar16[-1]._scChi + lVar9 + -0x28));
          lVar9 = lVar9 + -0x150;
        } while (lVar9 != 0);
      }
    }
  }
  return bVar21;
}

Assistant:

bool SMC::grow_one_with_sc(Structure &CurConf, const int Position, const int tmpEnd, const int LoopChosen,
                           const Atom &EndPt) {

    // Initialize positional values
    int phi_int, psi_int;

    // Initialize numbers of backbone states
    const int NumBBStates = this->num_dist_states;

    // The current residue
    const int CurResType = CurConf._res[Position]._type;

    // Placeholders for sampling
    DECLARE_VLA_2D(double, bb_angles, NumBBStates, 3);

    const int binNum = 180 / BBTbinSize;
    const double EEdisC = CurConf._res[Position]._atom[ATM_CA].dis(EndPt);
    double EEdisN = 0;

    const int RemLength = tmpEnd - Position;
    const double minEEDisC = minDistcon[1][RemLength];
    const double maxEEDisC = minDistcon[1][RemLength] + 31 * DistconBy[1][RemLength];
    const double minEEDisN = minDistcon[0][RemLength - 1];
    const double maxEEDisN = minDistcon[0][RemLength - 1] + 31 * DistconBy[0][RemLength - 1];
    
    int num_dead_labels = 0;

    /////////////////////////////////////////////////////////////////
    // Sample end-to-end distances and convert to positions.
    // End-to-end distances are sampled from an empirical distribution
    /////////////////////////////////////////////////////////////////

    // Early out if distance constraints are not satisfied
    // for carbon atom
    if (EEdisC < minEEDisC || EEdisC > maxEEDisC) {
        return false;
    }

    // BEGIN LargeNumDistanceStates scope
    {
        const int LargeNumDistanceStates = 160;
        DECLARE_VLA_2D(double, larbb_angles, LargeNumDistanceStates, 3);

        DECLARE_VLA_1D(int, Phi, LargeNumDistanceStates);
        DECLARE_VLA_1D(int, Psi, LargeNumDistanceStates);
        DECLARE_VLA_1D(int, TorProb, LargeNumDistanceStates);
        DECLARE_VLA_1D(int, deadlabel, LargeNumDistanceStates);

        SET_VLA_1D(int, deadlabel, LargeNumDistanceStates, 0);

        // Loop through states
        for (int i = 0; i < LargeNumDistanceStates; i++) {
            // Initialize four residues for this sample
            Residue sam;
            // Sample new points for C atom based on distance to final C
            TorProb[i] = -1;

            // Sample carbon atom
            sample_distance(CurConf._res[Position]._atom[ATM_N],
                            CurConf._res[Position]._atom[ATM_CA],
                            EndPt,
                            Residue::bond_angle[CurResType][ATM_C],
                            Residue::bond_length[CurResType][ATM_C],
                            sam._atom[ATM_C], EEdisC,
                            1, RemLength);

            // Skip if sampling failed (and try again)
            if (conditional_mark_dead_label(sam._atom[ATM_C].x, TorProb[i], deadlabel[i], num_dead_labels)) {
                continue;
            }

            // Sample new points for N atom based on distance to final C
            EEdisN = sam._atom[ATM_C].dis(EndPt);
            if (EEdisN >= minEEDisN && EEdisN <= maxEEDisN) {
                sample_distance(CurConf._res[Position]._atom[ATM_CA],
                                sam._atom[ATM_C],
                                EndPt,
                                Residue::bond_angle[CurResType][ATM_N],
                                Residue::bond_length[CurResType][ATM_N],
                                sam._atom[ATM_N], EEdisN,
                                // -1 since it's NEXT N
                                0, RemLength - 1);
            }
            else {
                TorProb[i] = 0;
                deadlabel[i] = 1;
                ++num_dead_labels;
                continue;
            }

            if (conditional_mark_dead_label(sam._atom[ATM_N].x, TorProb[i], deadlabel[i], num_dead_labels)) {
                continue;
            }

            // Populate remainder of bb_angles with the torsion angles
            // implied by the positional selections for C and N. This is for
            // unity with the existing code base. Omega = pi by default.
            // Note: PI/180 converts from degrees to radians
            larbb_angles[i][eix_phi] =
                    torsion(CurConf._res[Position - 1]._atom[ATM_C],
                            CurConf._res[Position]._atom[ATM_N],
                            CurConf._res[Position]._atom[ATM_CA],
                            sam._atom[ATM_C], torsion_degrees);
            larbb_angles[i][eix_psi] =
                    torsion(CurConf._res[Position]._atom[ATM_N],
                            CurConf._res[Position]._atom[ATM_CA],
                            sam._atom[ATM_C],
                            sam._atom[ATM_N], torsion_degrees);
            // Sample omega (peptide bond) angle from normal distribution
            box_MullerNsample_single(larbb_angles[i][eix_omega], PI, TO_RAD(4));

            // Box muller can return NaN because frand(0,1) can return value > 1 which
            // causes a negative log. This is due to weird FRAND padding with +0.5.
            // The fix is to use the <random> library which handles interval sampling properly.
            conditional_mark_dead_label(larbb_angles[i][eix_omega], TorProb[i], deadlabel[i], num_dead_labels);
        }

        // need to check if all are dead as could infinite loop forever
        if (num_dead_labels == LargeNumDistanceStates) {
            return false;
        }

        /////////////////////////////////////////////////////////////////
        // Of the candidates sampled from end-to-end distance distribution,
        //  select a subset of the generated candidates according to empirical
        //  phi, psi distribution.
        /////////////////////////////////////////////////////////////////

        // Typically, we now have LargeNumDistanceStates # of candidates
        // which have phi, psi torsion angles as determined by sampling
        // from empirical distance distribution. The next step is to select
        // a subset of the candidates (specifically a subset of size
        // NumStates) according to the empirical joint distribution of
        // phi, psi angles for the current residue being grown.
        {
            // @TODO - factor this out into a function, it's a bit
            // tricky because of the VLA arrays, but the best candidate
            // refactoring would be Method-to-Class where local variables
            // become the class variables

            int Total = 0;
            // This loop tallies up how many instances of the discretized
            // (phi, psi) pair have been observed. "TorProb" is actually a
            // misnomer (but effectively functions the same way when combined
            // with "Total" variable) as it is actually an observation count
            // and not a normalized probability.
            for (int i = 0; i < LargeNumDistanceStates; ++i) {

                if (TorProb[i] == -1) {
                    phi_int = (int)(larbb_angles[i][eix_phi] / BBTbinSize) + binNum;
                    psi_int = (int)(larbb_angles[i][eix_psi] / BBTbinSize) + binNum;

                    if (larbb_angles[i][eix_phi] / BBTbinSize + binNum - phi_int < 0)
                        --phi_int;
                    if (larbb_angles[i][eix_psi] / BBTbinSize + binNum - psi_int < 0)
                        --psi_int;
                    Phi[i] = phi_int;
                    Psi[i] = psi_int;

                    TorProb[i] = Joint_Angle[CurResType][phi_int][psi_int];
                    Total += TorProb[i];
                }
            }

            // Check if rotamer library usage has been enabled. The phi, psi
            // backbone libraries are histograms with observed phi, psi counts
            // for a training set of several thousand (~10k) loop samples.
            // However, the histograms have not been smoothed and therefore are
            // somewhat sparse and can make it hard to generate clash free loops.
            // In practice, using the rotamer libraries may lead to loop samples
            // with better RMSD to target structures - but with a cost of potentially
            // higher Lennard Jones potential energy.

            // Now actually select a smaller subset of candidates based on empirical
            // (phi, psi) distribution:
            if ((0 == Total) || !use_rot_lib) {
                for (int i = 0; i < NumBBStates; ++i) {
                    // @TODO - use actual uniform distribution
                    int r = rand() % LargeNumDistanceStates;
                    // Skip to next valid sampled state
                    while (1 == deadlabel[r])
                        r = ((r + 1) % LargeNumDistanceStates);

                    bb_angles[i][eix_phi] = frand((double)((Phi[r] - binNum) * PI / binNum),
                        (double)((Phi[r] - binNum + 1) * PI / binNum));
                    bb_angles[i][eix_psi] = frand((double)((Psi[r] - binNum) * PI / binNum),
                        (double)((Psi[r] - binNum + 1) * PI / binNum));
                    bb_angles[i][eix_omega] = larbb_angles[r][eix_omega];
                    continue;
                }
            }
            else {
                for (int i = 0; i < NumBBStates; ++i) {
                    // Select a random bin
                    int r = rand() % Total;
                    int cur = 0;
                    for (int j = 0; j < LargeNumDistanceStates; j++) {
                        cur += TorProb[j];
                        if (r < cur) {
                            // Select a random set of torsion angles within selected bin
                            bb_angles[i][eix_phi] = frand((double) ((Phi[j] - binNum) * PI / binNum),
                                                    (double) ((Phi[j] - binNum + 1) * PI / binNum));
                            bb_angles[i][eix_psi] = frand((double) ((Psi[j] - binNum) * PI / binNum),
                                                    (double) ((Psi[j] - binNum + 1) * PI / binNum));
                            bb_angles[i][eix_omega] = larbb_angles[j][eix_omega];
                            break;
                        }
                    }
                }
            }
        } // end select subset of backbone angles
    }